

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  Size *pSVar1;
  int *piVar2;
  int **ppiVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  byte *pbVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  Mat alp;
  Mat b_k;
  SharedMatting sm;
  Mat src;
  Mat element;
  Rect ccomp;
  Mat element_e;
  Mat trimap;
  Mat dil;
  Mat ero;
  Mat can;
  Mat can2;
  Mat can1;
  Mat out;
  undefined8 in_stack_fffffffffffff818;
  undefined4 uVar11;
  long *local_7d8;
  _InputArray *local_7d0;
  long local_7c8 [2];
  undefined1 local_7b8 [16];
  long local_7a8;
  _OutputArray local_798 [3];
  long *local_750;
  _InputArray local_738;
  _InputArray local_720 [3];
  long *local_6d8;
  undefined8 local_6c0;
  undefined8 local_6b8;
  undefined8 local_6b0;
  undefined8 local_6a8;
  undefined8 local_6a0;
  undefined8 local_698;
  undefined8 local_690;
  undefined8 local_688;
  undefined8 local_680;
  undefined8 local_678;
  undefined8 local_670;
  undefined8 local_668;
  undefined8 local_660;
  undefined8 local_658;
  undefined8 local_650;
  undefined8 local_648;
  undefined8 local_640;
  undefined8 local_638;
  undefined8 local_630;
  undefined8 local_628;
  undefined8 local_620;
  undefined1 local_618 [8];
  void *pvStack_610;
  Size local_608;
  undefined8 uStack_600;
  string local_468 [8];
  int local_460;
  uint local_45c;
  long local_458;
  undefined8 *local_428;
  long *local_420;
  _InputArray local_408 [4];
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  _OutputArray local_398 [4];
  Mat local_338 [96];
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  Mat local_270 [96];
  Mat local_210 [96];
  Mat local_1b0 [96];
  Mat local_150 [96];
  Mat local_f0 [96];
  Mat local_90 [96];
  
  uVar11 = (undefined4)((ulong)in_stack_fffffffffffff818 >> 0x20);
  local_618 = (undefined1  [8])&local_608;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_618,"input/lady1.jpg","");
  cv::imread(local_468,(int)local_618);
  if (local_618 != (undefined1  [8])&local_608) {
    operator_delete((void *)local_618,(long)local_608 + 1);
  }
  cv::Mat::Mat(local_90);
  cv::Mat::Mat(local_f0);
  cv::Mat::Mat(local_150);
  cv::Mat::Mat(local_1b0);
  cv::Mat::Mat(local_210);
  cv::Mat::Mat(local_270);
  cv::Mat::Mat(local_338);
  local_608.width = 0;
  local_608.height = 0;
  local_618._0_4_ = 0x1010000;
  pvStack_610 = local_468;
  local_408[0].sz.width = 0;
  local_408[0].sz.height = 0;
  local_408[0].flags = 0x2010000;
  local_620 = 0xa0000000a;
  local_628 = 0xffffffffffffffff;
  local_408[0].obj = local_90;
  cv::boxFilter(local_618,local_408,0xffffffff,&local_620,&local_628,1,CONCAT44(uVar11,4));
  local_608.width = 0;
  local_608.height = 0;
  local_618._0_4_ = 0x1010000;
  local_408[0].sz.width = 0;
  local_408[0].sz.height = 0;
  local_408[0].flags = 0x2010000;
  pvStack_610 = local_90;
  local_408[0].obj = local_f0;
  cv::Canny((_InputArray *)local_618,(_OutputArray *)local_408,36.0,36.0,3,false);
  local_3a8 = 0;
  uStack_3a0 = 0;
  local_608.width = 0;
  local_608.height = 0;
  local_618._0_4_ = 0x3010000;
  local_630 = 0xa0000000a;
  local_298 = 0;
  uStack_290 = 0;
  local_288 = 0;
  uStack_280 = 0;
  local_2b8 = 0x4008000000000000;
  uStack_2b0 = 0x4008000000000000;
  local_2a8 = 0x4008000000000000;
  uStack_2a0 = 0;
  local_2d8 = 0x4008000000000000;
  uStack_2d0 = 0x4008000000000000;
  local_2c8 = 0x4008000000000000;
  uStack_2c0 = 0;
  pvStack_610 = local_90;
  cv::floodFill();
  local_608.width = 0;
  local_608.height = 0;
  local_618._0_4_ = 0x1010000;
  local_408[0].sz.width = 0;
  local_408[0].sz.height = 0;
  local_408[0].flags = 0x2010000;
  pvStack_610 = local_90;
  local_408[0].obj = local_150;
  cv::Canny((_InputArray *)local_618,(_OutputArray *)local_408,15.0,15.0,3,false);
  local_608.width = 0;
  local_608.height = 0;
  local_618._0_4_ = 0x1010000;
  local_408[0].sz.width = 0;
  local_408[0].sz.height = 0;
  local_408[0].flags = 0x1010000;
  local_398[0].super__InputArray.sz.width = 0;
  local_398[0].super__InputArray.sz.height = 0;
  local_398[0].super__InputArray.flags = 0x2010000;
  pvStack_610 = local_f0;
  local_408[0].obj = local_150;
  local_398[0].super__InputArray.obj = local_1b0;
  cv::addWeighted((_InputArray *)local_618,1.0,local_408,1.0,0.0,local_398,-1);
  local_638 = 0x2300000023;
  local_640 = 0xffffffffffffffff;
  cv::getStructuringElement(local_408,2);
  local_648 = 0x3200000032;
  local_650 = 0xffffffffffffffff;
  cv::getStructuringElement(local_398,2);
  local_720[0].sz.width = 0;
  local_720[0].sz.height = 0;
  local_720[0].flags = 0x1010000;
  local_798[0].super__InputArray.sz.width = 0;
  local_798[0].super__InputArray.sz.height = 0;
  local_798[0].super__InputArray.flags = 0x2010000;
  local_7c8[0] = 0;
  local_7d8._0_4_ = 0x1010000;
  local_658 = 0xffffffffffffffff;
  local_618 = (undefined1  [8])0x7fefffffffffffff;
  pvStack_610 = (void *)0x7fefffffffffffff;
  local_608.width = -1;
  local_608.height = 0x7fefffff;
  uStack_600 = 0x7fefffffffffffff;
  local_7d0 = &local_398[0].super__InputArray;
  local_798[0].super__InputArray.obj = local_270;
  local_720[0].obj = local_1b0;
  cv::dilate();
  local_720[0].sz.width = 0;
  local_720[0].sz.height = 0;
  local_720[0].flags = 0x1010000;
  local_798[0].super__InputArray.sz.width = 0;
  local_798[0].super__InputArray.sz.height = 0;
  local_798[0].super__InputArray.flags = 0x2010000;
  local_7c8[0] = 0;
  local_7d8._0_4_ = 0x1010000;
  local_660 = 0xffffffffffffffff;
  local_618 = (undefined1  [8])0x7fefffffffffffff;
  pvStack_610 = (void *)0x7fefffffffffffff;
  local_608.width = -1;
  local_608.height = 0x7fefffff;
  uStack_600 = 0x7fefffffffffffff;
  local_7d0 = &local_398[0].super__InputArray;
  local_798[0].super__InputArray.obj = local_270;
  local_720[0].obj = local_270;
  cv::dilate();
  local_720[0].sz.width = 0;
  local_720[0].sz.height = 0;
  local_720[0].flags = 0x1010000;
  local_798[0].super__InputArray.sz.width = 0;
  local_798[0].super__InputArray.sz.height = 0;
  local_798[0].super__InputArray.flags = 0x2010000;
  local_7c8[0] = 0;
  local_7d8._0_4_ = 0x1010000;
  local_668 = 0xffffffffffffffff;
  local_618 = (undefined1  [8])0x7fefffffffffffff;
  pvStack_610 = (void *)0x7fefffffffffffff;
  local_608.width = -1;
  local_608.height = 0x7fefffff;
  uStack_600 = 0x7fefffffffffffff;
  local_7d0 = local_408;
  local_798[0].super__InputArray.obj = local_270;
  local_720[0].obj = local_270;
  cv::dilate();
  local_720[0].sz.width = 0;
  local_720[0].sz.height = 0;
  local_720[0].flags = 0x1010000;
  local_798[0].super__InputArray.sz.width = 0;
  local_798[0].super__InputArray.sz.height = 0;
  local_798[0].super__InputArray.flags = 0x2010000;
  local_7c8[0] = 0;
  local_7d8._0_4_ = 0x1010000;
  local_670 = 0xffffffffffffffff;
  local_618 = (undefined1  [8])0x7fefffffffffffff;
  pvStack_610 = (void *)0x7fefffffffffffff;
  local_608.width = -1;
  local_608.height = 0x7fefffff;
  uStack_600 = 0x7fefffffffffffff;
  local_7d0 = local_408;
  local_798[0].super__InputArray.obj = local_270;
  local_720[0].obj = local_270;
  cv::dilate();
  local_720[0].sz.width = 0;
  local_720[0].sz.height = 0;
  local_720[0].flags = 0x1010000;
  local_798[0].super__InputArray.sz.width = 0;
  local_798[0].super__InputArray.sz.height = 0;
  local_798[0].super__InputArray.flags = 0x2010000;
  local_7c8[0] = 0;
  local_7d8._0_4_ = 0x1010000;
  local_678 = 0xffffffffffffffff;
  local_618 = (undefined1  [8])0x7fefffffffffffff;
  pvStack_610 = (void *)0x7fefffffffffffff;
  local_608.width = -1;
  local_608.height = 0x7fefffff;
  uStack_600 = 0x7fefffffffffffff;
  local_7d0 = &local_398[0].super__InputArray;
  local_798[0].super__InputArray.obj = local_210;
  local_720[0].obj = local_270;
  cv::erode();
  local_720[0].sz.width = 0;
  local_720[0].sz.height = 0;
  local_720[0].flags = 0x1010000;
  local_798[0].super__InputArray.sz.width = 0;
  local_798[0].super__InputArray.sz.height = 0;
  local_798[0].super__InputArray.flags = 0x2010000;
  local_7c8[0] = 0;
  local_7d8._0_4_ = 0x1010000;
  local_680 = 0xffffffffffffffff;
  local_618 = (undefined1  [8])0x7fefffffffffffff;
  pvStack_610 = (void *)0x7fefffffffffffff;
  local_608.width = -1;
  local_608.height = 0x7fefffff;
  uStack_600 = 0x7fefffffffffffff;
  local_7d0 = &local_398[0].super__InputArray;
  local_798[0].super__InputArray.obj = local_210;
  local_720[0].obj = local_210;
  cv::erode();
  local_720[0].sz.width = 0;
  local_720[0].sz.height = 0;
  local_720[0].flags = 0x1010000;
  local_798[0].super__InputArray.sz.width = 0;
  local_798[0].super__InputArray.sz.height = 0;
  local_798[0].super__InputArray.flags = 0x2010000;
  local_7c8[0] = 0;
  local_7d8._0_4_ = 0x1010000;
  local_688 = 0xffffffffffffffff;
  local_618 = (undefined1  [8])0x7fefffffffffffff;
  pvStack_610 = (void *)0x7fefffffffffffff;
  local_608.width = -1;
  local_608.height = 0x7fefffff;
  uStack_600 = 0x7fefffffffffffff;
  local_7d0 = &local_398[0].super__InputArray;
  local_798[0].super__InputArray.obj = local_210;
  local_720[0].obj = local_210;
  cv::erode();
  local_720[0].sz.width = 0;
  local_720[0].sz.height = 0;
  local_720[0].flags = 0x1010000;
  local_798[0].super__InputArray.sz.width = 0;
  local_798[0].super__InputArray.sz.height = 0;
  local_798[0].super__InputArray.flags = 0x2010000;
  local_7c8[0] = 0;
  local_7d8._0_4_ = 0x1010000;
  local_690 = 0xffffffffffffffff;
  local_618 = (undefined1  [8])0x7fefffffffffffff;
  pvStack_610 = (void *)0x7fefffffffffffff;
  local_608.width = -1;
  local_608.height = 0x7fefffff;
  uStack_600 = 0x7fefffffffffffff;
  local_7d0 = &local_398[0].super__InputArray;
  local_798[0].super__InputArray.obj = local_210;
  local_720[0].obj = local_210;
  cv::erode();
  local_720[0].sz.width = 0;
  local_720[0].sz.height = 0;
  local_720[0].flags = 0x1010000;
  local_798[0].super__InputArray.sz.width = 0;
  local_798[0].super__InputArray.sz.height = 0;
  local_798[0].super__InputArray.flags = 0x2010000;
  local_7c8[0] = 0;
  local_7d8._0_4_ = 0x1010000;
  local_698 = 0xffffffffffffffff;
  local_618 = (undefined1  [8])0x7fefffffffffffff;
  pvStack_610 = (void *)0x7fefffffffffffff;
  local_608.width = -1;
  local_608.height = 0x7fefffff;
  uStack_600 = 0x7fefffffffffffff;
  local_7d0 = local_408;
  local_798[0].super__InputArray.obj = local_210;
  local_720[0].obj = local_210;
  cv::erode();
  local_720[0].sz.width = 0;
  local_720[0].sz.height = 0;
  local_720[0].flags = 0x1010000;
  local_798[0].super__InputArray.sz.width = 0;
  local_798[0].super__InputArray.sz.height = 0;
  local_798[0].super__InputArray.flags = 0x2010000;
  local_7c8[0] = 0;
  local_7d8 = (long *)CONCAT44(local_7d8._4_4_,0x1010000);
  local_6a0 = 0xffffffffffffffff;
  local_618 = (undefined1  [8])0x7fefffffffffffff;
  pvStack_610 = (void *)0x7fefffffffffffff;
  local_608.width = -1;
  local_608.height = 0x7fefffff;
  uStack_600 = 0x7fefffffffffffff;
  local_7d0 = local_408;
  local_798[0].super__InputArray.obj = local_210;
  local_720[0].obj = local_210;
  cv::erode();
  local_608.width = 0;
  local_608.height = 0;
  local_618._0_4_ = 0x1010000;
  local_720[0].sz.width = 0;
  local_720[0].sz.height = 0;
  local_720[0].flags = 0x1010000;
  local_798[0].super__InputArray.sz.width = 0;
  local_798[0].super__InputArray.sz.height = 0;
  local_798[0].super__InputArray.flags = 0x2010000;
  local_798[0].super__InputArray.obj = local_338;
  local_720[0].obj = local_210;
  pvStack_610 = local_270;
  cv::addWeighted((_InputArray *)local_618,0.5,local_720,0.5,0.0,local_798,-1);
  local_618 = (undefined1  [8])&local_608;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_618,"result/lady_trimap1.jpg","");
  local_720[0].sz.width = 0;
  local_720[0].sz.height = 0;
  local_720[0].flags = 0x1010000;
  local_798[0].super__InputArray.sz.width = 0;
  local_798[0].super__InputArray.sz.height = 0;
  local_798[0].super__InputArray._0_8_ = (void *)0x0;
  local_798[0].super__InputArray.obj = (void *)0x0;
  local_720[0].obj = local_338;
  cv::imwrite((string *)local_618,local_720,(vector *)local_798);
  if ((void *)local_798[0].super__InputArray._0_8_ != (void *)0x0) {
    operator_delete((void *)local_798[0].super__InputArray._0_8_,
                    (long)local_798[0].super__InputArray.sz - local_798[0].super__InputArray._0_8_);
  }
  if (local_618 != (undefined1  [8])&local_608) {
    operator_delete((void *)local_618,(long)local_608 + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  SharedMatting::SharedMatting((SharedMatting *)local_618);
  SharedMatting::loadImage((SharedMatting *)local_618,"input/lady1.jpg");
  SharedMatting::loadTrimap((SharedMatting *)local_618,"result/lady_trimap1.jpg");
  SharedMatting::solveAlpha((SharedMatting *)local_618);
  SharedMatting::save((SharedMatting *)local_618,"result/lady_alpha1.jpg");
  ppiVar3 = SharedMatting::alpha_return((SharedMatting *)local_618);
  pSVar1 = &local_798[0].super__InputArray.sz;
  local_798[0].super__InputArray._0_8_ = pSVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_798,"background/background.jpg","");
  cv::imread((string *)local_720,(int)local_798);
  if ((Size *)local_798[0].super__InputArray._0_8_ != pSVar1) {
    operator_delete((void *)local_798[0].super__InputArray._0_8_,
                    (long)local_798[0].super__InputArray.sz + 1);
  }
  local_7d8 = local_7c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"result/lady_alpha1.jpg","");
  cv::imread((string *)local_798,(int)&local_7d8);
  if (local_7d8 != local_7c8) {
    operator_delete(local_7d8,local_7c8[0] + 1);
  }
  local_7c8[0] = 0;
  local_7d8 = (long *)CONCAT44(local_7d8._4_4_,0x1010000);
  local_738.sz.width = 0;
  local_738.sz.height = 0;
  local_738.flags = 0x2010000;
  local_6a8 = 0xa0000000a;
  local_6b0 = 0xffffffffffffffff;
  local_7d0 = (_InputArray *)local_798;
  local_738.obj = (string *)local_798;
  cv::boxFilter(&local_7d8,&local_738,0xffffffff,&local_6a8,&local_6b0,1,4);
  local_7d8 = local_7c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"result/lady_alpha1.jpg","");
  local_738.sz.width = 0;
  local_738.sz.height = 0;
  local_738.flags = 0x1010000;
  local_7a8 = 0;
  local_7b8 = ZEXT816(0);
  local_738.obj = (string *)local_798;
  cv::imwrite((string *)&local_7d8,&local_738,(vector *)local_7b8);
  if ((void *)local_7b8._0_8_ != (void *)0x0) {
    operator_delete((void *)local_7b8._0_8_,local_7a8 - local_7b8._0_8_);
  }
  if (local_7d8 != local_7c8) {
    operator_delete(local_7d8,local_7c8[0] + 1);
  }
  lVar10 = (long)local_460;
  if (0 < lVar10) {
    lVar5 = 0;
    do {
      if (0 < (int)local_45c) {
        pbVar7 = (byte *)(*local_750 * lVar5 + (long)local_798[0].super__InputArray.sz);
        piVar2 = ppiVar3[lVar5];
        uVar9 = 0;
        do {
          piVar2[uVar9] = (uint)*pbVar7;
          uVar9 = uVar9 + 1;
          pbVar7 = pbVar7 + 3;
        } while (local_45c != uVar9);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar10);
  }
  local_7c8[0] = 0;
  local_7d8 = (long *)CONCAT44(local_7d8._4_4_,0x1010000);
  local_738.sz.width = 0;
  local_738.sz.height = 0;
  local_738.flags = 0x2010000;
  local_6b8 = CONCAT44((int)*local_428,(int)((ulong)*local_428 >> 0x20));
  local_7d0 = local_720;
  local_738.obj = local_720;
  cv::resize(0,0);
  if (0 < local_460) {
    lVar5 = 0;
    do {
      if (0 < (int)local_45c) {
        lVar4 = *local_6d8 * lVar5 + (long)local_720[0].sz;
        lVar6 = *local_420 * lVar5 + local_458;
        lVar8 = 2;
        uVar9 = 0;
        do {
          *(char *)(lVar6 + -2 + lVar8) =
               (char)(int)((1.0 - (double)ppiVar3[lVar5][uVar9] / 255.0) *
                           (double)*(byte *)(lVar4 + -2 + lVar8) +
                          ((double)*(byte *)(lVar6 + -2 + lVar8) * (double)ppiVar3[lVar5][uVar9]) /
                          255.0);
          *(char *)(lVar6 + -1 + lVar8) =
               (char)(int)((1.0 - (double)ppiVar3[lVar5][uVar9] / 255.0) *
                           (double)*(byte *)(lVar4 + -1 + lVar8) +
                          ((double)*(byte *)(lVar6 + -1 + lVar8) * (double)ppiVar3[lVar5][uVar9]) /
                          255.0);
          *(char *)(lVar6 + lVar8) =
               (char)(int)((1.0 - (double)ppiVar3[lVar5][uVar9] / 255.0) *
                           (double)*(byte *)(lVar4 + lVar8) +
                          ((double)*(byte *)(lVar6 + lVar8) * (double)ppiVar3[lVar5][uVar9]) / 255.0
                          );
          uVar9 = uVar9 + 1;
          lVar8 = lVar8 + 3;
        } while (local_45c != uVar9);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar10);
  }
  local_7d8 = local_7c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"result/lady_result1.jpg","")
  ;
  local_738.sz.width = 0;
  local_738.sz.height = 0;
  local_738.flags = 0x1010000;
  local_7a8 = 0;
  local_7b8 = (undefined1  [16])0x0;
  local_738.obj = local_468;
  cv::imwrite((string *)&local_7d8,&local_738,(vector *)local_7b8);
  if ((void *)local_7b8._0_8_ != (void *)0x0) {
    operator_delete((void *)local_7b8._0_8_,local_7a8 - local_7b8._0_8_);
  }
  if (local_7d8 != local_7c8) {
    operator_delete(local_7d8,local_7c8[0] + 1);
  }
  local_7c8[0] = 0;
  local_7d8 = (long *)CONCAT44(local_7d8._4_4_,0x1010000);
  local_738.sz.width = 0;
  local_738.sz.height = 0;
  local_738.flags = 0x2010000;
  local_6c0 = CONCAT44((int)*local_428,(int)((ulong)*local_428 >> 0x20));
  local_7d0 = (_InputArray *)local_468;
  local_738.obj = local_468;
  cv::resize(0,0);
  local_7d8 = local_7c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"result","");
  local_738.sz.width = 0;
  local_738.sz.height = 0;
  local_738.flags = 0x1010000;
  local_738.obj = local_468;
  cv::imshow((string *)&local_7d8,&local_738);
  if (local_7d8 != local_7c8) {
    operator_delete(local_7d8,local_7c8[0] + 1);
  }
  cv::waitKey(0);
  cv::Mat::~Mat((Mat *)local_798);
  cv::Mat::~Mat((Mat *)local_720);
  SharedMatting::~SharedMatting((SharedMatting *)local_618);
  cv::Mat::~Mat((Mat *)local_398);
  cv::Mat::~Mat((Mat *)local_408);
  cv::Mat::~Mat(local_338);
  cv::Mat::~Mat(local_270);
  cv::Mat::~Mat(local_210);
  cv::Mat::~Mat(local_1b0);
  cv::Mat::~Mat(local_150);
  cv::Mat::~Mat(local_f0);
  cv::Mat::~Mat(local_90);
  cv::Mat::~Mat((Mat *)local_468);
  return 0;
}

Assistant:

int main()
{
	Mat src = imread("input/lady1.jpg");
	Mat out, can1,can2, can, ero, dil,trimap;
	boxFilter(src, out, -1, Size(10, 10));
	Canny(out, can1, 36, 36, 3);
       
	Rect ccomp;
	floodFill(out, Point(10, 10), Scalar(0, 0, 0), &ccomp, Scalar(3, 3, 3), Scalar(3, 3, 3));
	Canny(out, can2, 15, 15, 3);
	addWeighted(can1, 1.0, can2, 1.0, 0.0, can);

	/*floodFill(out, Point(10, 10), Scalar(0, 0, 0), &ccomp, Scalar(3, 3, 3), Scalar(3, 3, 3));
	floodFill(out, Point(1963, 2400), Scalar(0, 0, 0), &ccomp, Scalar(3, 3, 3), Scalar(3, 3, 3));*/
    Mat element = getStructuringElement(MORPH_ELLIPSE, Size(35, 35));
	Mat element_e = getStructuringElement(MORPH_ELLIPSE, Size(50, 50));
	dilate(can, dil, element_e);
	dilate(dil, dil, element_e);
	dilate(dil, dil, element);
	dilate(dil, dil, element);
	erode(dil, ero, element_e);
	erode(ero, ero, element_e);
	erode(ero, ero, element_e);
	erode(ero, ero, element_e);
	erode(ero, ero, element);
    erode(ero, ero, element);
	//cvtColor(out, g_grayImage, CV_RGB2GRAY);
	//threshold(g_grayImage, g_dstImage, g_nThresholdValue, 255, g_nThresholdType);
	addWeighted(dil,0.5,ero,0.5,0.0,trimap);
	//imwrite("dil.jpg", dil);
	//imwrite("ero.jpg", ero);
	imwrite("result/lady_trimap1.jpg", trimap);
	cout << "ok" << endl; 

        SharedMatting sm;
        sm.loadImage("input/lady1.jpg");
        sm.loadTrimap("result/lady_trimap1.jpg");
        sm.solveAlpha();
        sm.save("result/lady_alpha1.jpg");
        int ** alpha = sm.alpha_return();
        Mat b_k = imread("background/background.jpg");
        Mat alp = imread("result/lady_alpha1.jpg");
        boxFilter(alp, alp, -1, Size(10, 10));
        imwrite("result/lady_alpha1.jpg", alp);
        int src_row = src.rows;
        int src_col = src.cols;
        int i,j;
       for (i=0; i<src_row ;i++) 
        {
          
           for (j=0; j<src_col; j++)
           {
              alpha[i][j] = double (alp.at<Vec3b>(i,j)[0]); 
           }
        }
    
        resize(b_k, b_k, src.size());

        for (i=0; i<src_row ;i++) 
        {
           uchar* data_s = src.ptr<uchar>(i);
           uchar* data_b = b_k.ptr<uchar>(i);
           uchar* data_a = alp.ptr<uchar>(i);
           for (j=0; j<src_col; j++)
           {
              data_s[3*j] = uchar(double(data_s[3*j]) * double(alpha[i][j])/255.0 + double(data_b[3*j]) * (1.0 - double(alpha[i][j])/255.0)); 
             data_s[3*j+1] = uchar(double(data_s[3*j+1]) * double(alpha[i][j])/255.0 + double(data_b[3*j+1]) * (1.0 - double(alpha[i][j])/255.0)); 
             data_s[3*j+2] = uchar(double(data_s[3*j+2]) * double(alpha[i][j])/255.0 + double(data_b[3*j+2]) * (1.0 - double(alpha[i][j])/255.0)); 
           }
        }
        imwrite("result/lady_result1.jpg", src);
        resize(src, src, src.size());
        imshow("result",src);
        waitKey(0);
    return 0;
}